

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseTemplateArgs(State *state)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    iVar2 = ((guard.state_)->parse_state).mangled_idx;
    iVar3 = ((guard.state_)->parse_state).out_cur_idx;
    uVar1 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
    DisableAppend(guard.state_);
    bVar4 = ParseOneCharToken(guard.state_,'I');
    if ((bVar4) && (bVar4 = OneOrMore(ParseTemplateArg,guard.state_), bVar4)) {
      bVar4 = ParseQRequiresClauseExpr(guard.state_);
      bVar4 = Optional(bVar4);
      if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)) {
        RestoreAppend(guard.state_,SUB81((ulong)uVar1 >> 0x3f,0));
        MaybeAppend(guard.state_,"<>");
        state_local._7_1_ = true;
        goto LAB_00103b17;
      }
    }
    ((guard.state_)->parse_state).mangled_idx = iVar2;
    ((guard.state_)->parse_state).out_cur_idx = iVar3;
    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
    state_local._7_1_ = false;
  }
LAB_00103b17:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') && OneOrMore(ParseTemplateArg, state) &&
      Optional(ParseQRequiresClauseExpr(state)) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  state->parse_state = copy;
  return false;
}